

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMap.c
# Opt level: O3

If_Obj_t *
Lpk_MapTree_rec(Lpk_Man_t *p,Kit_DsdNtk_t *pNtk,If_Obj_t **ppLeaves,int iLit,If_Obj_t *pResult)

{
  ushort uVar1;
  Kit_DsdObj_t *pKVar2;
  If_Obj_t *pIVar3;
  If_Obj_t *pIVar4;
  uint uVar5;
  Kit_DsdObj_t KVar6;
  uint *puVar7;
  ulong uVar8;
  If_Obj_t *local_b8 [17];
  
  if (iLit < 0) {
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x74,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  uVar5 = (uint)iLit >> 1;
  uVar1 = pNtk->nVars;
  if ((uint)pNtk->nNodes + (uint)uVar1 <= uVar5) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if ((uVar5 < uVar1) ||
     (pKVar2 = pNtk->pNodes[(ulong)uVar5 - (ulong)uVar1], pKVar2 == (Kit_DsdObj_t *)0x0)) {
    return (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)ppLeaves[uVar5]);
  }
  KVar6 = *pKVar2;
  switch((uint)KVar6 >> 6 & 7) {
  case 1:
    return (If_Obj_t *)((ulong)(iLit & 1) ^ (ulong)p->pIfMan->pConst1);
  case 2:
    return (If_Obj_t *)
           ((ulong)((iLit ^ (uint)*(ushort *)(pKVar2 + 1)) & 1) ^
           *(ulong *)((long)ppLeaves + (ulong)(*(ushort *)(pKVar2 + 1) & 0xfffffffe) * 4));
  case 3:
    if (((uint)KVar6 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x88,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar2 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar2[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (pIVar4 == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    pIVar4 = If_ManCreateAnd(p->pIfMan,pIVar4,pResult);
    break;
  case 4:
    if (((uint)KVar6 & 0xfc000000) != 0x8000000) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                    ,0x93,
                    "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                   );
    }
    pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)(pKVar2 + 1),(If_Obj_t *)0x0);
    if (pResult == (If_Obj_t *)0x0) {
      pResult = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)*(ushort *)&pKVar2[1].field_0x2,
                                (If_Obj_t *)0x0);
    }
    if (pIVar4 == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    if (pResult == (If_Obj_t *)0x0) {
      return (If_Obj_t *)0x0;
    }
    uVar5 = (iLit ^ (uint)pResult ^ (uint)pIVar4) & 1;
    pIVar4 = If_ManCreateXor(p->pIfMan,(If_Obj_t *)((ulong)pIVar4 & 0xfffffffffffffffe),
                             (If_Obj_t *)((ulong)pResult & 0xfffffffffffffffe));
    goto LAB_004bd233;
  case 5:
    p->nBlocks[(uint)KVar6 >> 0x1a] = p->nBlocks[(uint)KVar6 >> 0x1a] + 1;
    KVar6 = *pKVar2;
    if ((uint)KVar6 < 0x4000000) {
      uVar5 = (uint)KVar6 >> 0x1a;
    }
    else {
      uVar8 = 0;
      do {
        uVar5 = (uint)*(ushort *)((long)&pKVar2[1].field_0x0 + uVar8 * 2);
        if (uVar8 == 0) {
          pIVar4 = pResult;
          pIVar3 = pResult;
          if (pResult == (If_Obj_t *)0x0) {
            pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,uVar5,(If_Obj_t *)0x0);
            pIVar3 = pIVar4;
          }
        }
        else {
          pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,uVar5,(If_Obj_t *)0x0);
          local_b8[uVar8] = pIVar4;
          pIVar3 = local_b8[0];
        }
        local_b8[0] = pIVar3;
        if (pIVar4 == (If_Obj_t *)0x0) {
          return (If_Obj_t *)0x0;
        }
        uVar8 = uVar8 + 1;
        KVar6 = *pKVar2;
        uVar5 = (uint)KVar6 >> 0x1a;
      } while (uVar8 < uVar5);
    }
    if ((0 < p->pPars->nVarsShared) && (p->pPars->nLutSize < (int)uVar5)) {
      puVar7 = (uint *)0x0;
      if (((uint)KVar6 & 0x1c0) == 0x140) {
        puVar7 = (uint *)((long)&pKVar2[1].field_0x0 + (ulong)((uint)KVar6 >> 8 & 0x3fc));
      }
      pIVar4 = Lpk_MapSuppRedDec_rec(p,puVar7,uVar5,local_b8);
      if (pIVar4 != (If_Obj_t *)0x0) {
        return (If_Obj_t *)((ulong)pIVar4 ^ (ulong)(iLit & 1));
      }
      KVar6 = *pKVar2;
    }
    puVar7 = (uint *)0x0;
    if (((uint)KVar6 & 0x1c0) == 0x140) {
      puVar7 = (uint *)((long)&pKVar2[1].field_0x0 + (ulong)((uint)KVar6 >> 8 & 0x3fc));
    }
    pIVar4 = Lpk_MapPrime(p,puVar7,(uint)KVar6 >> 0x1a,local_b8);
    break;
  default:
    __assert_fail("pObj->Type == KIT_DSD_PRIME",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/lpk/lpkMap.c"
                  ,0x9c,
                  "If_Obj_t *Lpk_MapTree_rec(Lpk_Man_t *, Kit_DsdNtk_t *, If_Obj_t **, int, If_Obj_t *)"
                 );
  }
  uVar5 = iLit & 1;
LAB_004bd233:
  return (If_Obj_t *)((ulong)uVar5 ^ (ulong)pIVar4);
}

Assistant:

If_Obj_t * Lpk_MapTree_rec( Lpk_Man_t * p, Kit_DsdNtk_t * pNtk, If_Obj_t ** ppLeaves, int iLit, If_Obj_t * pResult )
{
    Kit_DsdObj_t * pObj;
    If_Obj_t * pObjNew = NULL, * pObjNew2 = NULL, * pFansNew[16];
    unsigned i, iLitFanin;

    assert( iLit >= 0 );

    // consider the case of a gate
    pObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(iLit)];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        return If_NotCond( If_ManConst1(p->pIfMan), Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_VAR )
    {
        pObjNew = ppLeaves[Abc_Lit2Var(pObj->pFans[0])];
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) ^ Abc_LitIsCompl(pObj->pFans[0]) );
    }
    if ( pObj->Type == KIT_DSD_AND )
    {
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        pObjNew = If_ManCreateAnd( p->pIfMan, pFansNew[0], pFansNew[1] ); 
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        assert( pObj->nFans == 2 );
        pFansNew[0] = Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[0], NULL );
        pFansNew[1] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, pObj->pFans[1], NULL );
        if ( pFansNew[0] == NULL || pFansNew[1] == NULL )
            return NULL;
        fCompl ^= If_IsComplement(pFansNew[0]) ^ If_IsComplement(pFansNew[1]);
        pObjNew = If_ManCreateXor( p->pIfMan, If_Regular(pFansNew[0]), If_Regular(pFansNew[1]) );
        return If_NotCond( pObjNew, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    p->nBlocks[pObj->nFans]++;

    // solve for the inputs
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        if ( i == 0 )
            pFansNew[i] = pResult? pResult : Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        else
            pFansNew[i] = Lpk_MapTree_rec( p, pNtk, ppLeaves, iLitFanin, NULL );
        if ( pFansNew[i] == NULL )
            return NULL;
    }
/* 
    if ( !p->fCofactoring && p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew = Lpk_MapTreeMulti( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
    }
*/
/*
    if ( (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapTreeMux_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
//        if ( pObjNew2 )
//            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }
*/

    // find best cofactoring variable
    if ( p->pPars->nVarsShared > 0 && (int)pObj->nFans > p->pPars->nLutSize )
    {
        pObjNew2 = Lpk_MapSuppRedDec_rec( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );
        if ( pObjNew2 )
            return If_NotCond( pObjNew2, Abc_LitIsCompl(iLit) );
    }

    pObjNew = Lpk_MapPrime( p, Kit_DsdObjTruth(pObj), pObj->nFans, pFansNew );

    // add choice
    if ( pObjNew && pObjNew2 )
    {
        If_ObjSetChoice( If_Regular(pObjNew), If_Regular(pObjNew2) );
        If_ManCreateChoice( p->pIfMan, If_Regular(pObjNew) );
    }
    return If_NotCond( pObjNew, Abc_LitIsCompl(iLit) );
}